

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O1

void __thiscall
wasm::WATParser::ParseDeclsCtx::ParseDeclsCtx(ParseDeclsCtx *this,Lexer *in,Module *wasm)

{
  _Alloc_hider _Var1;
  char *pcVar2;
  
  (this->in).pos = in->pos;
  std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::vector
            (&(this->in).annotations,&in->annotations);
  (this->in).file.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  if ((in->file).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    (this->in).file.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p =
         ((pointer)
         ((long)&(this->in).file.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload + 0x10))._M_p;
    _Var1._M_p = (in->file).
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(this->in).file,_Var1._M_p,
               _Var1._M_p +
               (in->file).
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               ._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload._M_value._M_string_length);
    (this->in).file.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = true;
  }
  pcVar2 = (in->buffer)._M_str;
  (this->in).buffer._M_len = (in->buffer)._M_len;
  (this->in).buffer._M_str = pcVar2;
  this->wasm = wasm;
  memset(&this->recTypeDefs,0,0x120);
  (this->implicitElemIndices)._M_h._M_buckets = &(this->implicitElemIndices)._M_h._M_single_bucket;
  (this->implicitElemIndices)._M_h._M_bucket_count = 1;
  (this->implicitElemIndices)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->implicitElemIndices)._M_h._M_element_count = 0;
  (this->implicitElemIndices)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->implicitElemIndices)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->implicitElemIndices)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->funcCounter = 0;
  this->tableCounter = 0;
  this->memoryCounter = 0;
  this->globalCounter = 0;
  *(undefined8 *)((long)&this->globalCounter + 1) = 0;
  *(undefined8 *)((long)&this->dataCounter + 1) = 0;
  return;
}

Assistant:

ParseDeclsCtx(Lexer& in, Module& wasm) : in(in), wasm(wasm) {}